

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension.cpp
# Opt level: O3

char * duckdb::Extension::DefaultVersion(void)

{
  bool bVar1;
  char *pcVar2;
  allocator local_29;
  string local_28;
  
  pcVar2 = DuckDB::LibraryVersion();
  ::std::__cxx11::string::string((string *)&local_28,pcVar2,&local_29);
  bVar1 = ExtensionHelper::IsRelease(&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  if (bVar1) {
    pcVar2 = DuckDB::LibraryVersion();
  }
  else {
    pcVar2 = DuckDB::SourceID();
  }
  return pcVar2;
}

Assistant:

const char *Extension::DefaultVersion() {
	if (ExtensionHelper::IsRelease(DuckDB::LibraryVersion())) {
		return DuckDB::LibraryVersion();
	}
	return DuckDB::SourceID();
}